

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O3

int message_queue_is_empty(MESSAGE_QUEUE_HANDLE message_queue,_Bool *is_empty)

{
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE pLVar2;
  int iVar3;
  _Bool _Var4;
  
  if (message_queue == (MESSAGE_QUEUE_HANDLE)0x0 || is_empty == (_Bool *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x22d;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"message_queue_is_empty",0x22c,1,"invalid argument (message_queue=%p, is_empty=%p)"
                ,message_queue,is_empty);
    }
  }
  else {
    pLVar2 = singlylinkedlist_get_head_item(message_queue->pending);
    iVar3 = 0;
    _Var4 = false;
    if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
      pLVar2 = singlylinkedlist_get_head_item(message_queue->in_progress);
      _Var4 = pLVar2 == (LIST_ITEM_HANDLE)0x0;
    }
    *is_empty = _Var4;
  }
  return iVar3;
}

Assistant:

int message_queue_is_empty(MESSAGE_QUEUE_HANDLE message_queue, bool* is_empty)
{
    int result;

    if (message_queue == NULL || is_empty == NULL)
    {
        LogError("invalid argument (message_queue=%p, is_empty=%p)", message_queue, is_empty);
        result = MU_FAILURE;
    }
    else
    {
        *is_empty = (singlylinkedlist_get_head_item(message_queue->pending) == NULL && singlylinkedlist_get_head_item(message_queue->in_progress) == NULL);
        result = RESULT_OK;
    }

    return result;
}